

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t detect_form(archive_read *a,wchar_t *is_form_d)

{
  byte bVar1;
  ssize_t sVar2;
  char cVar3;
  wchar_t wVar4;
  int iVar5;
  byte *b;
  ulong uVar6;
  void *pvVar7;
  ssize_t sVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte *p;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  int local_68;
  int local_64;
  ssize_t avail;
  archive_read *local_48;
  ssize_t nl;
  ulong local_38;
  
  if (is_form_d != (wchar_t *)0x0) {
    *is_form_d = L'\0';
  }
  local_48 = a;
  b = (byte *)__archive_read_ahead(a,1,&avail);
  if (b == (byte *)0x0) {
    wVar4 = L'\xffffffff';
  }
  else {
    local_64 = 0;
    cVar3 = '\0';
    local_68 = 0;
    lVar17 = avail;
LAB_0013ab55:
    uVar15 = avail;
    if (avail == 0) {
      nl = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = get_line_size((char *)b,avail,&nl);
    }
    bVar18 = false;
    while (nl == 0) {
      if ((bVar18) || (uVar15 != uVar6)) goto LAB_0013af88;
      if (0xfffff < (long)uVar15) goto LAB_0013af79;
      uVar6 = (ulong)((int)lVar17 + 0x3ffU & 0xfffffc00);
      pvVar7 = __archive_read_ahead(local_48,uVar6 << (uVar6 < lVar17 + 0xa0U),&avail);
      if (pvVar7 == (void *)0x0) {
        if (avail <= lVar17) {
          uVar6 = 0;
          goto LAB_0013af88;
        }
        pvVar7 = __archive_read_ahead(local_48,avail,&avail);
        bVar18 = true;
      }
      else {
        bVar18 = false;
      }
      sVar2 = avail;
      b = (byte *)((long)pvVar7 + (lVar17 - uVar15));
      uVar16 = avail - (lVar17 - uVar15);
      avail = uVar16;
      sVar8 = get_line_size((char *)((long)pvVar7 + lVar17),uVar16 - uVar15,&nl);
      uVar6 = 0;
      if (-1 < sVar8) {
        uVar6 = uVar15;
      }
      uVar6 = uVar6 + sVar8;
      uVar15 = uVar16;
      lVar17 = sVar2;
    }
    if (0 < (long)uVar6) {
      uVar16 = ~nl;
      if (cVar3 != '\0') {
        wVar4 = bid_keyword_list((char *)b,uVar6,L'\0',L'\0');
        if (wVar4 < L'\x01') {
LAB_0013af79:
          uVar6 = 0xffffffffffffffff;
          goto LAB_0013af88;
        }
        b = b + uVar6;
        if ((b[uVar16] != 0x5c) && (bVar18 = cVar3 == '\x01', cVar3 = '\0', bVar18)) {
          if (1 < local_64) goto LAB_0013af9c;
          local_64 = local_64 + 1;
        }
        avail = uVar15 - uVar6;
        goto LAB_0013ab55;
      }
      pbVar14 = b + uVar6;
      pbVar10 = b + uVar16;
      uVar11 = uVar15;
      for (uVar13 = uVar6; uVar11 = uVar11 - 1, 0 < (long)uVar13; uVar13 = uVar13 - 1) {
        bVar1 = *b;
        if ((bVar1 != 0x20) && (uVar6 = uVar13, bVar1 != 9)) goto LAB_0013acf5;
        b = b + 1;
        uVar15 = uVar15 - 1;
        pbVar10 = pbVar10 + 1;
        avail = uVar11;
      }
      bVar1 = *pbVar14;
      uVar6 = 0;
      b = pbVar14;
LAB_0013acf5:
      if (((bVar1 == 10) || (bVar1 == 0xd)) || (bVar1 == 0x23)) {
LAB_0013ad09:
        b = b + uVar6;
        if ((long)uVar13 < 1) {
          uVar13 = 0;
        }
        avail = uVar15 - uVar13;
        goto LAB_0013ab55;
      }
      if (bVar1 == 0x2f) {
        if (uVar6 < 5) goto LAB_0013af88;
        iVar5 = strncmp((char *)b,"/set",4);
        if (iVar5 == 0) {
          pbVar14 = b + 4;
          lVar9 = uVar6 - 4;
          wVar4 = L'\0';
        }
        else {
          if ((uVar6 < 7) || (iVar5 = strncmp((char *)b,"/unset",6), iVar5 != 0)) goto LAB_0013af79;
          pbVar14 = b + 6;
          lVar9 = uVar6 - 6;
          wVar4 = L'\x01';
        }
        wVar4 = bid_keyword_list((char *)pbVar14,lVar9,wVar4,L'\0');
        if (wVar4 < L'\x01') goto LAB_0013af79;
        cVar3 = (b[uVar16 + uVar6] == 0x5c) * '\x02';
        goto LAB_0013ad09;
      }
      lVar9 = -nl;
      pbVar14 = b + uVar6;
      uVar11 = 0;
      if (0 < (long)uVar13) {
        uVar11 = uVar13;
      }
      bVar18 = true;
      for (p = b; p < pbVar14; p = p + 1) {
        bVar1 = *p;
        if (bid_entry_safe_char[bVar1] == '\0') {
          if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_0013addd;
          break;
        }
        uVar11 = uVar11 - 1;
        bVar18 = false;
      }
      if (!bVar18) {
        wVar4 = L'\0';
        bVar18 = true;
LAB_0013aec2:
        local_38 = uVar16;
        wVar4 = bid_keyword_list((char *)p,uVar11,L'\0',wVar4);
        if (wVar4 < L'\0') goto LAB_0013af88;
        if (local_68 == 1) {
          if ((bool)(bVar18 & wVar4 != L'\0')) {
            local_68 = 1;
            goto LAB_0013af88;
          }
LAB_0013af3c:
          if (bVar18) {
LAB_0013af41:
            if (pbVar14[local_38] == 0x5c) {
              cVar3 = '\x01';
              goto LAB_0013ad09;
            }
          }
        }
        else {
          if (local_68 != 0) goto LAB_0013af3c;
          local_68 = 1;
          if (bVar18) {
            local_68 = -(uint)(wVar4 != L'\0');
            goto LAB_0013af41;
          }
        }
        if (local_64 < 2) {
          local_64 = local_64 + 1;
          cVar3 = '\0';
          goto LAB_0013ad09;
        }
        goto LAB_0013af9c;
      }
LAB_0013addd:
      if ((((pbVar14 + lVar9 + -2 < b) || (pbVar14[lVar9 + -1] != 0x5c)) ||
          ((bVar1 = pbVar14[lVar9 + -2], bVar1 != 9 && (bVar1 != 0x20)))) &&
         ((pbVar14 + lVar9 + -1 < b || (pbVar14[lVar9 + -1] != 0x5c)))) {
        lVar12 = 0;
        uVar11 = 0;
        if (0 < (long)uVar13) {
          uVar11 = uVar13;
        }
        bVar18 = false;
        for (pbVar10 = pbVar10 + uVar11 + ((long)uVar13 >> 0x3f & uVar13); b <= pbVar10;
            pbVar10 = pbVar10 + -1) {
          bVar1 = *pbVar10;
          if ((bVar1 == 9) || (bVar1 == 0x20)) break;
          if (bid_entry_safe_char[bVar1] == '\0') goto LAB_0013af88;
          if (bVar1 == 0x2f) {
            bVar18 = true;
          }
          lVar12 = lVar12 + 1;
        }
        if ((((int)lVar12 != 0) && (bVar18)) && (pbVar10[1] != 0x2f)) {
          bVar18 = false;
          uVar11 = 0;
          if (0 < (long)uVar13) {
            uVar11 = uVar13;
          }
          uVar11 = (lVar9 + uVar11) - lVar12;
          wVar4 = L'\x01';
          p = b;
          goto LAB_0013aec2;
        }
      }
    }
LAB_0013af88:
    if (local_64 < 3) {
      if (local_64 < 1) {
        return L'\0';
      }
      if (uVar6 != 0) {
        return L'\0';
      }
    }
LAB_0013af9c:
    wVar4 = L' ';
    if ((is_form_d != (wchar_t *)0x0) && (local_68 == 1)) {
      *is_form_d = L'\x01';
    }
  }
  return wVar4;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is an mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}